

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O3

bool __thiscall units::detail::unit_data::hasValidRoot(unit_data *this,int power)

{
  unit_data uVar1;
  
  uVar1 = *this;
  if (((((((((int)uVar1 << 0x1c) >> 0x1c) % power == 0) && (((int)uVar1._0_1_ >> 4) % power == 0))
        && ((((int)uVar1 << 0x15) >> 0x1d) % power == 0)) &&
       (((((int)uVar1 << 0x12) >> 0x1d) % power == 0 && (((int)uVar1._0_2_ >> 0xe) % power == 0))))
      && (((((int)uVar1 << 0xd) >> 0x1d) % power == 0 &&
          (((((int)uVar1 << 0xb) >> 0x1e) % power == 0 && ((((int)uVar1 << 8) >> 0x1d) % power == 0)
           ))))) && ((((int)uVar1 << 6) >> 0x1e) % power == 0)) {
    return -1 < (int)uVar1 && (((int)uVar1 << 4) >> 0x1e) % power == 0;
  }
  return false;
}

Assistant:

constexpr bool hasValidRoot(int power) const
        {
            return meter_ % power == 0 && second_ % power == 0 &&
                kilogram_ % power == 0 && ampere_ % power == 0 &&
                candela_ % power == 0 && kelvin_ % power == 0 &&
                mole_ % power == 0 && radians_ % power == 0 &&
                currency_ % power == 0 && count_ % power == 0 &&
                equation_ == 0U;
        }